

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

char fsnav_linal_check_measurement_residual
               (double *x,double *S,double z,double *h,double sigma,double k_sigma,size_t n)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = sigma * sigma;
  lVar2 = 1;
  for (sVar3 = 0; sVar3 != n; sVar3 = sVar3 + 1) {
    dVar7 = 0.0;
    sVar1 = sVar3;
    lVar4 = n - 1;
    for (lVar5 = 0; lVar2 != lVar5; lVar5 = lVar5 + 1) {
      dVar7 = dVar7 + h[lVar5] * S[sVar1];
      sVar1 = sVar1 + lVar4;
      lVar4 = lVar4 + -1;
    }
    z = z + -h[sVar3] * x[sVar3];
    dVar6 = dVar6 + dVar7 * dVar7;
    lVar2 = lVar2 + 1;
  }
  if (dVar6 < 0.0) {
    dVar6 = sqrt(dVar6);
  }
  else {
    dVar6 = SQRT(dVar6);
  }
  return ABS(z) < dVar6 * k_sigma;
}

Assistant:

char fsnav_linal_check_measurement_residual(double* x, double* S, double z, double* h, double sigma, double k_sigma, const size_t n)
{
	size_t i, j, k;

	double s;

	sigma = sigma*sigma;
	for (i = 0; i < n; i++) {
		// dz = z - h*x: residual
		z -= h[i]*x[i];
		// s = h*S*S^T*h^T: predicted variance 
		for (j = 0, k = i, s = 0; j <= i; j++, k += n-j)
			s += h[j]*S[k];
		sigma += s*s;
	}
	sigma = sqrt(sigma);

	return (fabs(z) < k_sigma*sigma) ? 1 : 0;
}